

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::PutVal(TPZSkylMatrix<double> *this,int64_t r,int64_t c,double *value)

{
  double dVar1;
  bool bVar2;
  TPZSkylMatrix<double> *this_00;
  int64_t iVar3;
  ostream *this_01;
  double **ppdVar4;
  double *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t index;
  int64_t col;
  int64_t row;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  int64_t in_stack_ffffffffffffffa8;
  TPZSkylMatrix<double> *this_02;
  long local_38;
  long local_30;
  double *local_28;
  
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RCX;
  if (in_RDX < in_RSI) {
    TPZMatrix<double>::Swap(&local_30,&local_38);
  }
  this_00 = (TPZSkylMatrix<double> *)(local_38 - local_30);
  this_02 = this_00;
  iVar3 = Size(this_00,in_stack_ffffffffffffffa8);
  if (((long)this_02 < iVar3) || (bVar2 = IsZero(*local_28), bVar2)) {
    iVar3 = Size(this_02,in_stack_ffffffffffffffa8);
    if (iVar3 <= (long)this_00) {
      return 1;
    }
  }
  else {
    this_01 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size");
    iVar3 = Size(this_02,(int64_t)this_01);
    std::ostream::operator<<(this_01,iVar3);
    std::ostream::flush();
    TPZMatrix<double>::Error(in_stack_000001a0,in_stack_00000198);
  }
  dVar1 = *local_28;
  ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 0x20),local_38);
  (*ppdVar4)[(long)this_00] = dVar1;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}